

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint extraout_EAX;
  FILE *__stream;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s1;
  int cnum;
  int length;
  uint8_t vbios [1048576];
  int in_stack_ffffffffffefffb0;
  int in_stack_ffffffffffefffb4;
  
  __stream = _stderr;
  iVar2 = nva_init();
  if (iVar2 != 0) {
    main_cold_1();
    return 1;
  }
  pcVar4 = (char *)0x0;
  do {
    while( true ) {
      while (__s1 = pcVar4, pcVar5 = (char *)(ulong)(uint)argc, iVar2 = getopt(argc,argv,"hc:s:S:"),
            pcVar4 = __s1, iVar2 < 99) {
        if (iVar2 == -1) {
          if (nva_cardsnum < 1) {
            if (nva_cardsnum == 0) {
              main_cold_5();
              return 1;
            }
            main_cold_4();
            return 1;
          }
          if (__s1 == (char *)0x0) {
            main_cold_8();
            if ((extraout_EAX & 1) == 0) {
              return 1;
            }
          }
          else {
            iVar2 = strcasecmp(__s1,"pramin");
            if (iVar2 == 0) {
              in_stack_ffffffffffefffb4 =
                   vbios_extract_pramin(0,&stack0xffffffffffefffc8,(int *)&stack0xffffffffffefffb0);
              if (in_stack_ffffffffffefffb4 == -2) {
                main_cold_7();
                in_stack_ffffffffffefffb4 = -2;
              }
            }
            else {
              iVar2 = strcasecmp(__s1,"prom");
              if (iVar2 != 0) goto LAB_00102cea;
              in_stack_ffffffffffefffb4 =
                   vbios_extract_prom(0,&stack0xffffffffffefffc8,(int *)&stack0xffffffffffefffb0);
            }
          }
          iVar2 = fileno(_stdout);
          iVar2 = isatty(iVar2);
          if (iVar2 == 0) {
            fwrite(&stack0xffffffffffefffc8,1,(long)in_stack_ffffffffffefffb0,_stdout);
          }
          else {
            main_cold_9();
          }
          uVar1 = *(uint *)((long)(*nva_cards)->bar0 + 0x101000);
          iVar2 = fileno(__stream);
          iVar2 = isatty(iVar2);
          pcVar4 = 
          "Your strap peek is: 0x%x\nPlease save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n"
          ;
          if (iVar2 == 0) {
            pcVar4 = "0x%x";
          }
          fprintf(__stream,pcVar4,(ulong)uVar1);
          if (in_stack_ffffffffffefffb4 == -2) {
            main_cold_10();
          }
          else if (in_stack_ffffffffffefffb4 == 1) {
            main_cold_11();
          }
          return (uint)(in_stack_ffffffffffefffb4 != 1);
        }
        if ((iVar2 == 0x53) && (__stream = fopen(_optarg,"w+"), __stream == (FILE *)0x0)) {
          main_cold_2();
          return 1;
        }
      }
      if (iVar2 != 99) break;
      __isoc99_sscanf(_optarg,"%d",&stack0xffffffffffefffac);
    }
    pcVar4 = _optarg;
  } while ((iVar2 == 0x73) || (pcVar4 = __s1, iVar2 != 0x68));
  main_cold_3();
  __s1 = pcVar5;
LAB_00102cea:
  main_cold_6();
  if ((*__s1 == 'U') && (__s1[1] == -0x56)) {
    uVar3 = (ulong)*(ushort *)(__s1 + 0x18);
    if ((((__s1[uVar3] == 'P') && (__s1[uVar3 + 1] == 'C')) && (__s1[uVar3 + 2] == 'I')) &&
       (__s1[uVar3 + 3] == 'R')) {
      return 1;
    }
    nv_checksignature_cold_2();
  }
  else {
    nv_checksignature_cold_1();
  }
  return -2;
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;
	FILE *strap_peek_output = stderr;
	int32_t strap_peek;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:S:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
			case 'S':
				strap_peek_output = fopen(optarg, "w+");
				if (!strap_peek_output) {
					fprintf(stderr, "-S: Error while opening %s: %s\n",
						optarg, strerror(errno));
					return 1;
				}
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	/* Extraction */
	if (!source) {
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Autodetecting.\n");
		if (nva_cards[cnum]->chipset.chipset < 4) {
			result = vbios_extract_prom(cnum, vbios, &length);
		} else {
			result = vbios_extract_pramin(cnum, vbios, &length);
			if (result != EOK)
				result = vbios_extract_prom(cnum, vbios, &length);
		}

		if (result != EOK) {
			fprintf(stderr, "Autodetection failed, aborting.\n");
			return 1;
		}
	}
	else if (strcasecmp(source, "pramin") == 0) {
		result = vbios_extract_pramin(cnum, vbios, &length);
		if (result == ESIG)
			fprintf(stderr, "You may want to run nvagetbios -s prom instead!\n");
	}
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	strap_peek = extract_strap_peek(cnum);
	if (isatty(fileno(strap_peek_output))) {
		fprintf(strap_peek_output,
			"Your strap peek is: 0x%x\n"
			"Please save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n",
			strap_peek);
	} else {
		fprintf(strap_peek_output, "0x%x", strap_peek);
	}

	if (result == EOK)
		fprintf(stderr, "Vbios extracted successfully!\n");
	else if (result == ESIG)
		fprintf(stderr, "Vbios extracted but it may be corrupted!\n");

	return result != EOK;
}